

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

void morphos_writeexec(GlobalVars *gv,FILE *f)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  LinkedSection *pLVar4;
  char *size;
  uint8_t *puVar5;
  GlobalVars *in_RSI;
  long in_RDI;
  lword bss_va;
  unsigned_long bss_offset;
  Symbol *nextsym;
  Symbol *sym;
  Section *nextsec;
  Section *sec;
  LinkedSection *sbss;
  Section *bss_sec;
  int sbflag;
  int sdflag;
  LinkedSection *ls;
  undefined8 in_stack_ffffffffffffffb0;
  node *name;
  node *n;
  GlobalVars *in_stack_ffffffffffffffc0;
  LinkedSection *in_stack_ffffffffffffffc8;
  GlobalVars *in_stack_ffffffffffffffd0;
  LinkedSection *in_stack_ffffffffffffffd8;
  int iVar6;
  FILE *f_00;
  
  iVar6 = 0;
  bVar2 = false;
  for (f_00 = *(FILE **)(in_RDI + 0x1d8); *(long *)f_00 != 0; f_00 = *(FILE **)f_00) {
    if (((ulong)f_00->_IO_write_base & 0x400) != 0) {
      if (*(char *)&f_00->_IO_write_base == '\x02') {
        pLVar4 = (LinkedSection *)find_first_bss_sec((LinkedSection *)f_00);
        if (iVar6 != 0) {
          error(0x7c,fff[*(byte *)(in_RDI + 0x58)]->tname);
        }
        iVar6 = 1;
        f_00->_IO_read_base = ".sdata";
        in_stack_ffffffffffffffd8 = pLVar4;
        if ((pLVar4 != (LinkedSection *)0x0) && (f_00->_IO_save_end < f_00->_IO_backup_base)) {
          name = (node *)f_00->__pad5;
          uVar1 = pLVar4->copybase;
          size = f_00->_IO_save_base + uVar1;
          in_stack_ffffffffffffffd0 =
               (GlobalVars *)
               create_lnksect(in_stack_ffffffffffffffc0,(char *)name,
                              (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
                              (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30),
                              (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x28),
                              (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (uint32_t)in_stack_ffffffffffffffd0);
          in_stack_ffffffffffffffd0->osec_base_name =
               f_00->_IO_backup_base + -in_stack_ffffffffffffffd8->copybase;
          puVar5 = (uint8_t *)alloc((size_t)size);
          *(uint8_t **)&in_stack_ffffffffffffffd0->small_data = puVar5;
          in_stack_ffffffffffffffc8 = pLVar4;
          while (pLVar4 = (LinkedSection *)(in_stack_ffffffffffffffc8->n).next,
                pLVar4 != (LinkedSection *)0x0) {
            remnode(&in_stack_ffffffffffffffc8->n);
            addtail((list *)&in_stack_ffffffffffffffd0->keep_relocs,&in_stack_ffffffffffffffc8->n);
            in_stack_ffffffffffffffc8->name = (char *)in_stack_ffffffffffffffd0;
            in_stack_ffffffffffffffc8->copybase = in_stack_ffffffffffffffc8->copybase - uVar1;
            in_stack_ffffffffffffffc8 = pLVar4;
          }
          in_stack_ffffffffffffffc0 = (GlobalVars *)0x0;
          while (n = name, name = n->next, name != (node *)0x0) {
            if ((GlobalVars *)n[3].pred[1].pred == in_stack_ffffffffffffffd0) {
              remnode(n);
              addtail((list *)&in_stack_ffffffffffffffd0->trace_syms,n);
              n[3].next = (node *)((long)n[3].next - (long)size);
            }
          }
          f_00->_IO_backup_base =
               f_00->_IO_backup_base + -(long)in_stack_ffffffffffffffd0->osec_base_name;
          in_stack_ffffffffffffffb0 = 0;
        }
      }
      else if (*(char *)&f_00->_IO_write_base == '\x03') {
        if (bVar2) {
          error(0x7c,fff[*(byte *)(in_RDI + 0x58)]->tname);
        }
        bVar2 = true;
        f_00->_IO_read_base = ".sbss";
      }
    }
    if (((ulong)f_00->_IO_write_base & 0x200) == 0) {
      f_00->_IO_save_end = f_00->_IO_backup_base;
    }
    iVar3 = strcmp(f_00->_IO_read_base,ddrelocs_name);
    if (iVar3 == 0) {
      make_ddrelocs(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  elf32_writeobject(in_RSI,f_00,(uint16_t)((uint)iVar6 >> 0x10),(int8_t)((uint)iVar6 >> 8),
                    (_func_uint8_t_Reloc_ptr *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void morphos_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a target-elf32morphos executable file, which in */
/* reality is a relocatable object too, but all symbol references have */
/* been resolved */
{
  struct LinkedSection *ls;
  int sdflag=0,sbflag=0;

  for (ls=(struct LinkedSection *)gv->lnksec.first; ls->n.next!=NULL;
       ls=(struct LinkedSection *)ls->n.next) {

    if (ls->flags & SF_SMALLDATA) {
      /* data sections should be called .sdata, and bss sections .sbss */

      if (ls->type == ST_DATA) {  /* .sdata */
        struct Section *bss_sec = find_first_bss_sec(ls);

        if (sdflag)
          error(124,fff[gv->dest_format]->tname);
        sdflag = 1;
        ls->name = sdata_name;

        if (bss_sec && (ls->filesize < ls->size)) {
          /* put bss-part of .sdata into an own section called .sbss */
          struct LinkedSection *sbss;
          struct Section *sec = bss_sec;
          struct Section *nextsec;
          struct Symbol *sym = (struct Symbol *)ls->symbols.first;
          struct Symbol *nextsym;
          unsigned long bss_offset = bss_sec->offset;
          lword bss_va = (lword)(ls->base + bss_offset);

          sbss = create_lnksect(gv,sbss_name,ST_UDATA,
                                ls->flags|SF_UNINITIALIZED,
                                ls->protection,ls->alignment,ls->memattr);
          sbss->size = ls->size - bss_sec->offset;
          sbss->data = alloc(sbss->size);

          /* move bss sections from .sdata to .sbss */
          while (nextsec = (struct Section *)sec->n.next) {
            remnode(&sec->n);
            addtail(&sbss->sections,&sec->n);
            sec->lnksec = sbss;
            sec->offset -= bss_offset;
            sec = nextsec;
          }

          /* move symbols */
          while (nextsym = (struct Symbol *)sym->n.next) {
            /* move bss symbols to .sbss */
            if (sym->relsect->lnksec == sbss) {
              remnode(&sym->n);
              addtail(&sbss->symbols,&sym->n);
              sym->value -= bss_va;
            }
            sym = nextsym;
          }
          /* no relocs and no xrefs can occur in bss */

          ls->size -= sbss->size;  /* the bss part is gone */
        }
      }

      else if (ls->type == ST_UDATA) {
        if (sbflag)
          error(124,fff[gv->dest_format]->tname);
        sbflag = 1;
        ls->name = sbss_name;
      }
    }

    /* set filesize to memsize for all sections */
    if (!(ls->flags & SF_UNINITIALIZED))
      ls->filesize = ls->size;

    /* setup ddrelocs section, if present */
    if (!strcmp(ls->name,ddrelocs_name))
      make_ddrelocs(gv,ls);
  }

  elf32_writeobject(gv,f,EM_PPC,_BIG_ENDIAN_,ppc32_reloc_vlink2elf);
}